

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  pointer ppTVar8;
  long lVar9;
  TestPartResult *pTVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  pointer pbVar15;
  byte bVar16;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  TestResult *this_00;
  pointer ppEVar17;
  pointer pbVar19;
  pointer ppEVar20;
  TestSuite *this_01;
  allocator<char> local_71;
  uint local_70;
  int local_6c;
  pointer local_68;
  pointer local_60;
  undefined8 local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined8 uVar18;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&g_argvs_abi_cxx11_);
  pbVar15 = local_50.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  if (g_help_flag == '\0') {
    PostFlagParsingInit(this);
    WriteToShardStatusFileIfNeeded();
    pIVar1 = (this->internal_run_death_test_flag_)._M_t.
             super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ._M_t.
             super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>.
             _M_head_impl;
    bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                        pIVar1 != (InternalRunDeathTestFlag *)0x0);
    local_6c = FilterTests(this,(uint)!bVar5);
    if (FLAGS_gtest_list_tests != '\x01') {
      iVar12 = 0;
      if (FLAGS_gtest_shuffle == '\x01') {
        iVar12 = FLAGS_gtest_random_seed;
        if (FLAGS_gtest_random_seed == 0) {
          lVar7 = std::chrono::_V2::system_clock::now();
          iVar12 = (int)(SUB168(SEXT816(lVar7) * SEXT816(0x431bde82d7b634db),8) >> 0x12) -
                   (SUB164(SEXT816(lVar7) * SEXT816(0x431bde82d7b634db),0xc) >> 0x1f);
        }
        iVar12 = (iVar12 - 1U) % 99999 + 1;
      }
      this->random_seed_ = iVar12;
      pTVar2 = (this->listeners_).repeater_;
      lVar7 = std::chrono::_V2::system_clock::now();
      this->start_timestamp_ = lVar7 / 1000000;
      (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2,this->parent_);
      uVar13 = 1;
      if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
        uVar13 = FLAGS_gtest_repeat;
      }
      if (uVar13 != 0) {
        local_68 = local_50.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        local_60 = pbVar15;
        uVar18 = 0;
        uVar14 = 0;
        local_70 = uVar13;
LAB_0011f9be:
        ppTVar3 = (this->test_suites_).
                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (ppTVar8 = (this->test_suites_).
                       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                       ._M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar3;
            ppTVar8 = ppTVar8 + 1) {
          TestSuite::ClearResult(*ppTVar8);
        }
        lVar7 = std::chrono::_V2::system_clock::now();
        lVar7 = SUB168(SEXT816(lVar7) * SEXT816(-0x431bde82d7b634db),8);
        if (0 < local_6c) {
          local_58 = uVar18;
          if (FLAGS_gtest_shuffle == '\x01') {
            (this->random_).state_ = this->random_seed_;
            ShuffleTests(this);
          }
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                    (pTVar2,this->parent_,uVar14);
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
          ppEVar17 = (this->environments_).
                     super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          for (ppEVar20 = (this->environments_).
                          super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppEVar20 != ppEVar17;
              ppEVar20 = ppEVar20 + 1) {
            (**(code **)(*(long *)*ppEVar20 + 0x10))();
          }
          (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
          bVar5 = Test::IsSkipped();
          if (bVar5) {
            UnitTest::GetInstance();
            if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
              if ((UnitTest::GetInstance::instance.impl_)->current_test_suite_ == (TestSuite *)0x0)
              {
                this_00 = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
              }
              else {
                this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_suite_->
                           ad_hoc_test_result_;
              }
            }
            else {
              this_00 = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
            }
            if (0 < (int)((ulong)((long)(this_00->test_part_results_).
                                        super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_00->test_part_results_).
                                       super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                    -0x49249249) {
              iVar12 = 0;
              do {
                pTVar10 = TestResult::GetTestPartResult(this_00,iVar12);
                if (pTVar10->type_ == kSkip) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_50,(pTVar10->message_)._M_dataplus._M_p,&local_71);
                  puts((char *)local_50.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
                  if (local_50.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      (pointer)&local_50.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    operator_delete(local_50.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (ulong)((long)&((local_50.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus)._M_p + 1));
                  }
                }
                iVar12 = iVar12 + 1;
                iVar6 = (int)((ulong)((long)(this_00->test_part_results_).
                                            super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(this_00->test_part_results_).
                                           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 4);
              } while (SBORROW4(iVar12,iVar6 * -0x49249249) != iVar12 + iVar6 * 0x49249249 < 0);
            }
            fflush(_stdout);
          }
          else {
            bVar5 = Test::HasFatalFailure();
            if ((!bVar5) &&
               (ppTVar8 = (this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
               0 < (int)((ulong)((long)(this->test_suites_).
                                       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8)
                        >> 3))) {
              lVar11 = 1;
              do {
                TestSuite::Run(ppTVar8[(uint)(this->test_suite_indices_).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[lVar11 + -1]]);
                if (FLAGS_gtest_fail_fast == '\x01') {
                  piVar4 = (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((lVar11 + -1 <
                       (long)(int)((ulong)((long)(this->test_suite_indices_).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish -
                                          (long)piVar4) >> 2)) &&
                     (lVar9 = (long)piVar4[lVar11 + -1], -1 < lVar9)) {
                    this_01 = (this->test_suites_).
                              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar9];
                  }
                  else {
                    this_01 = (TestSuite *)0x0;
                  }
                  iVar12 = TestSuite::failed_test_count(this_01);
                  if ((0 < iVar12) ||
                     (bVar5 = TestResult::Failed(&this_01->ad_hoc_test_result_), bVar5))
                  goto LAB_0011fb9d;
                }
                ppTVar8 = (this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar5 = lVar11 < (int)((ulong)((long)(this->test_suites_).
                                                                                                          
                                                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)ppTVar8) >> 3);
                lVar11 = lVar11 + 1;
              } while (bVar5);
            }
          }
          goto LAB_0011fc65;
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])(pTVar2,this->parent_,uVar14)
        ;
        goto LAB_0011fca7;
      }
      bVar16 = 1;
      pbVar19 = local_50.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_0011fd50;
    }
    ListTestsMatchingFilter(this);
  }
  bVar16 = 1;
  goto LAB_0011fd7b;
LAB_0011fb9d:
  for (; ppTVar8 = (this->test_suites_).
                   super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
      (int)lVar11 <
      (int)((ulong)((long)(this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8) >> 3);
      lVar11 = lVar11 + 1) {
    TestSuite::Skip(ppTVar8[(uint)(this->test_suite_indices_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar11]]);
  }
LAB_0011fc65:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])(pTVar2,this->parent_);
  ppEVar20 = (this->environments_).
             super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (ppEVar17 = (this->environments_).
                  super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish; ppEVar17 != ppEVar20;
      ppEVar17 = ppEVar17 + -1) {
    (**(code **)(*(long *)ppEVar17[-1] + 0x18))();
  }
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
  uVar18 = local_58;
LAB_0011fca7:
  lVar11 = std::chrono::_V2::system_clock::now();
  this->elapsed_time_ = lVar11 / 1000000 + ((lVar7 >> 0x12) - (lVar7 >> 0x3f));
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xf])(pTVar2,this->parent_,uVar14);
  bVar5 = Passed(this);
  UnshuffleTests(this);
  if (FLAGS_gtest_shuffle == '\x01') {
    iVar12 = GetNextRandomSeed(this->random_seed_);
    this->random_seed_ = iVar12;
  }
  bVar16 = (byte)uVar18 | !bVar5;
  uVar18 = CONCAT71((int7)((ulong)uVar18 >> 8),bVar16);
  uVar13 = (int)uVar14 + 1;
  uVar14 = (ulong)uVar13;
  if (uVar13 == local_70 && -1 < (int)local_70) goto code_r0x0011fd3a;
  goto LAB_0011f9be;
code_r0x0011fd3a:
  bVar16 = bVar16 ^ 1;
  pbVar15 = local_60;
  pbVar19 = local_68;
LAB_0011fd50:
  (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0x10])(pTVar2,this->parent_);
  if (pbVar19 == pbVar15) {
    ColoredPrintf(kRed,
                  "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                 );
  }
LAB_0011fd7b:
  return (bool)(bVar16 & 1);
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}